

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  SessionHandle *data;
  undefined8 uVar1;
  int iVar2;
  _Bool _Var3;
  uint uVar4;
  CURLcode CVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  ulong uVar9;
  int error;
  int local_98;
  CURLcode local_94;
  long local_90;
  timeval local_88;
  _Bool *local_78;
  ulong local_70;
  char ipaddress [46];
  
  data = conn->data;
  error = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
LAB_004e8894:
    CVar5 = CURLE_OK;
  }
  else {
    local_98 = sockindex;
    local_88 = curlx_tvnow();
    local_70 = Curl_timeleft(data,&local_88,true);
    if ((long)local_70 < 0) {
      Curl_failf(data,"Connection time-out");
      CVar5 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      local_94 = CURLE_OK;
      local_90 = (long)sockindex;
      local_78 = connected;
      for (uVar9 = 0; uVar9 != 2; uVar9 = uVar9 + 1) {
        if (conn->tempsock[uVar9] != -1) {
          uVar4 = Curl_socket_check(-1,-1,conn->tempsock[uVar9],0);
          if (uVar4 == 2) {
            _Var3 = verifyconnect(conn->tempsock[uVar9],&error);
            if (_Var3) {
              conn->sock[local_90] = conn->tempsock[uVar9];
              conn->ip_addr = conn->tempaddr[uVar9];
              conn->tempsock[uVar9] = -1;
              if (conn->tempsock[uVar9 ^ 1] != -1) {
                Curl_closesocket(conn,conn->tempsock[uVar9 ^ 1]);
                conn->tempsock[uVar9 ^ 1] = -1;
              }
              CVar5 = Curl_connected_proxy(conn,local_98);
              lVar6 = local_90;
              if (CVar5 != CURLE_OK) {
                return CVar5;
              }
              (conn->bits).tcpconnect[local_90] = true;
              *local_78 = true;
              if (local_98 == 0) {
                Curl_pgrsTime(data,TIMER_CONNECT);
              }
              Curl_updateconninfo(conn,conn->sock[lVar6]);
              Curl_verboseconnect(conn);
              goto LAB_004e8894;
            }
            Curl_infof(data,"Connection failed\n");
          }
          else if (uVar4 == 0) {
            lVar6 = curlx_tvdiff(local_88,conn->connecttime);
            if (conn->timeoutms_per_addr <= lVar6) {
              Curl_infof(data,"After %ldms connect time, move on!\n");
              error = 0x6e;
            }
            if (((uVar9 == 0) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (lVar6 = curlx_tvdiff(local_88,conn->connecttime), 199 < lVar6)) {
              trynextip(conn,local_98,1);
            }
          }
          else if ((uVar4 & 4) != 0) {
            verifyconnect(conn->tempsock[uVar9],&error);
          }
          iVar2 = error;
          if (error != 0) {
            (data->state).os_errno = error;
            piVar7 = __errno_location();
            *piVar7 = iVar2;
            if (conn->tempaddr[uVar9] != (Curl_addrinfo *)0x0) {
              Curl_printable_address(conn->tempaddr[uVar9],ipaddress,0x2e);
              lVar6 = conn->port;
              pcVar8 = Curl_strerror(conn,error);
              Curl_infof(data,"connect to %s port %ld failed: %s\n",ipaddress,lVar6,pcVar8);
              conn->timeoutms_per_addr =
                   local_70 >> (conn->tempaddr[uVar9]->ai_next != (Curl_addrinfo *)0x0);
              local_94 = trynextip(conn,local_98,(int)uVar9);
            }
          }
        }
      }
      CVar5 = CURLE_OK;
      if (local_94 != CURLE_OK) {
        if ((conn->tempaddr[1] == (Curl_addrinfo *)0x0) &&
           (CVar5 = trynextip(conn,local_98,1), CVar5 == CURLE_OK)) {
          return CURLE_OK;
        }
        uVar1 = *(undefined8 *)(conn->primary_ip + (ulong)(conn->bits).proxy * 0x20 + -0x3c);
        lVar6 = conn->port;
        pcVar8 = Curl_strerror(conn,error);
        Curl_failf(data,"Failed to connect to %s port %ld: %s",uVar1,lVar6,pcVar8);
        CVar5 = local_94;
      }
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct SessionHandle *data = conn->data;
  CURLcode code = CURLE_OK;
  long allow;
  int error = 0;
  struct timeval now;
  int result;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_tvnow();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i=0; i<2; i++) {
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    result = Curl_socket_ready(CURL_SOCKET_BAD, conn->tempsock[i], 0);

    if(result == 0) { /* no connection yet */
      if(curlx_tvdiff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         curlx_tvdiff(now, conn->connecttime) >= HAPPY_EYEBALLS_TIMEOUT) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(result == CURL_CSELECT_OUT) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */
        int other = i ^ 1;

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        code = Curl_connected_proxy(conn, sockindex);
        if(code)
          return code;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      else
        infof(data, "Connection failed\n");
    }
    else if(result & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      char ipaddress[MAX_IPADR_LEN];
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        code = trynextip(conn, sockindex, i);
      }
    }
  }

  if(code) {
    /* no more addresses to try */

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      int rc;
      rc = trynextip(conn, sockindex, 1);
      if(rc == CURLE_OK)
        return CURLE_OK;
    }

    failf(data, "Failed to connect to %s port %ld: %s",
          conn->bits.proxy?conn->proxy.name:conn->host.name,
          conn->port, Curl_strerror(conn, error));
  }

  return code;
}